

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O3

matrix_type * __thiscall
Disa::Matrix_Dense<double,2ul,3ul>::operator*=
          (Matrix_Dense<double,2ul,3ul> *this,Matrix_Dense<double,_2UL,_3UL> *matrix)

{
  bool bVar1;
  bool bVar2;
  double *pdVar3;
  size_t i_column;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  Vector_Dense<double,_3UL> *pVVar9;
  double dVar10;
  double local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  double dStack_30;
  undefined8 local_28;
  
  local_28 = *(undefined8 *)(this + 0x20);
  local_38 = *(undefined8 *)(this + 0x10);
  dStack_30 = *(double *)(this + 0x18);
  local_48 = *(double *)this;
  uStack_40 = *(undefined8 *)(this + 8);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  lVar6 = 0;
  pdVar3 = &local_48;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    lVar7 = 0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      lVar4 = 0;
      do {
        if (bVar1) {
          *(undefined8 *)(this + lVar4 * 8 + lVar6 * 0x18) = 0;
          dVar10 = 0.0;
          pdVar8 = pdVar3;
          pVVar9 = (Vector_Dense<double,_3UL> *)matrix;
        }
        else {
          dVar10 = *(double *)(this + lVar4 * 8 + lVar6 * 0x18);
          pdVar8 = pdVar3 + lVar7;
          pVVar9 = (matrix->super_array<Disa::Vector_Dense<double,_3UL>,_2UL>)._M_elems + lVar7;
        }
        *(double *)(this + lVar4 * 8 + lVar6 * 0x18) =
             *pdVar8 * ((array<Disa::Vector_Dense<double,_3UL>,_2UL> *)
                       &pVVar9->super_array<double,_3UL>)->_M_elems[0].super_array<double,_3UL>.
                       _M_elems[lVar4] + dVar10;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar7 = 1;
      bVar2 = false;
    } while (bVar1);
    lVar6 = 1;
    pdVar3 = &dStack_30;
    bVar2 = false;
  } while (bVar5);
  return (matrix_type *)this;
}

Assistant:

constexpr matrix_type& operator*=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    // For static containers the matrices must be square.
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    matrix_type copy;
    std::swap(*this, copy);
    FOR(i_row, size_row()) {
      FOR(i_row_other, matrix.size_row()) {
        FOR(i_column, size_column()) {
          if(i_row_other == 0) (*this)[i_row][i_column] = 0.0;
          (*this)[i_row][i_column] += copy[i_row][i_row_other] * matrix[i_row_other][i_column];
        }
      }
    }
    return *this;
  }